

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O2

void __thiscall icu_63::UVector::setSize(UVector *this,int32_t newSize,UErrorCode *status)

{
  UBool UVar1;
  long lVar2;
  int index;
  
  if (-1 < newSize) {
    index = this->count;
    if (index < newSize) {
      UVar1 = ensureCapacity(this,newSize,status);
      if (UVar1 == '\0') {
        return;
      }
      for (lVar2 = (long)this->count; lVar2 < (long)(ulong)(uint)newSize; lVar2 = lVar2 + 1) {
        this->elements[lVar2].pointer = (void *)0x0;
      }
    }
    else {
      while (newSize < index) {
        index = index + -1;
        removeElementAt(this,index);
      }
    }
    this->count = newSize;
  }
  return;
}

Assistant:

void UVector::setSize(int32_t newSize, UErrorCode &status) {
    int32_t i;
    if (newSize < 0) {
        return;
    }
    if (newSize > count) {
        if (!ensureCapacity(newSize, status)) {
            return;
        }
        UElement empty;
        empty.pointer = NULL;
        empty.integer = 0;
        for (i=count; i<newSize; ++i) {
            elements[i] = empty;
        }
    } else {
        /* Most efficient to count down */
        for (i=count-1; i>=newSize; --i) {
            removeElementAt(i);
        }
    }
    count = newSize;
}